

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O3

long __thiscall
cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>::fill
          (cubeb_resampler_speex<float,_delay_line<float>,_cubeb_resampler_speex_one_way<float>_>
           *this,void *input_buffer,long *input_frames_count,void *output_buffer,
          long output_frames_needed)

{
  long lVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = (code *)this->fill_internal;
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(UNRECOVERED_JUMPTABLE +
                   *(long *)((long)&(this->super_cubeb_resampler)._vptr_cubeb_resampler +
                            *(long *)&this->field_0x20) + -1);
  }
  lVar1 = (*UNRECOVERED_JUMPTABLE)();
  return lVar1;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill(
    void * input_buffer, long * input_frames_count, void * output_buffer,
    long output_frames_needed)
{
  /* Input and output buffers, typed */
  T * in_buffer = reinterpret_cast<T *>(input_buffer);
  T * out_buffer = reinterpret_cast<T *>(output_buffer);
  return (this->*fill_internal)(in_buffer, input_frames_count, out_buffer,
                                output_frames_needed);
}